

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::InsertEdgeIntoAEL(Clipper *this,TEdge *edge,TEdge *startEdge)

{
  TEdge **ppTVar1;
  _func_int **pp_Var2;
  long lVar3;
  long lVar4;
  TEdge *pTVar5;
  long lVar6;
  cInt cVar7;
  bool bVar8;
  double dVar9;
  
  pp_Var2 = this->_vptr_Clipper;
  pTVar5 = *(TEdge **)
            (pp_Var2[-3] + 0x10 +
            (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  if (pTVar5 == (TEdge *)0x0) {
    edge->NextInAEL = (TEdge *)0x0;
    edge->PrevInAEL = (TEdge *)0x0;
LAB_00111b03:
    startEdge = (TEdge *)((long)&this->_vptr_Clipper + (long)pp_Var2[-3]);
  }
  else {
    if (startEdge == (TEdge *)0x0) {
      lVar3 = (pTVar5->Curr).X;
      lVar6 = (edge->Curr).X;
      startEdge = pTVar5;
      if (lVar6 == lVar3) {
        lVar3 = (edge->Top).Y;
        lVar6 = (pTVar5->Top).Y;
        if (lVar6 < lVar3) {
          dVar9 = (double)(lVar3 - (pTVar5->Bot).Y) * pTVar5->Dx;
          if ((edge->Top).X <
              (long)(dVar9 + *(double *)(&DAT_0011d070 + (ulong)(dVar9 < 0.0) * 8)) +
              (pTVar5->Bot).X) {
LAB_00111ae1:
            edge->PrevInAEL = (TEdge *)0x0;
            edge->NextInAEL =
                 *(TEdge **)
                  (pp_Var2[-3] + 0x10 +
                  (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
            *(TEdge **)
             (*(long *)(pp_Var2[-3] + 0x10 +
                       (long)&(this->m_Maxima).
                              super__List_base<long_long,_std::allocator<long_long>_>) + 0x70) =
                 edge;
            goto LAB_00111b03;
          }
        }
        else {
          if (lVar3 == lVar6) {
            cVar7 = (edge->Top).X;
          }
          else {
            dVar9 = (double)(lVar6 - (edge->Bot).Y) * edge->Dx;
            cVar7 = (long)(dVar9 + *(double *)(&DAT_0011d070 + (ulong)(dVar9 < 0.0) * 8)) +
                    (edge->Bot).X;
          }
          if (cVar7 < (pTVar5->Top).X) goto LAB_00111ae1;
        }
      }
      else if (lVar6 < lVar3) goto LAB_00111ae1;
    }
    if (startEdge->NextInAEL != (TEdge *)0x0) {
      lVar3 = (edge->Curr).X;
      pTVar5 = startEdge->NextInAEL;
      do {
        lVar6 = (pTVar5->Curr).X;
        bVar8 = SBORROW8(lVar3,lVar6);
        lVar4 = lVar3 - lVar6;
        if (lVar3 == lVar6) {
          lVar6 = (edge->Top).Y;
          lVar4 = (pTVar5->Top).Y;
          if (lVar4 < lVar6) {
            dVar9 = (double)(lVar6 - (pTVar5->Bot).Y) * pTVar5->Dx;
            lVar6 = (long)(dVar9 + *(double *)(&DAT_0011d070 + (ulong)(dVar9 < 0.0) * 8)) +
                    (pTVar5->Bot).X;
            lVar4 = (edge->Top).X;
            bVar8 = SBORROW8(lVar4,lVar6);
            lVar4 = lVar4 - lVar6;
            goto LAB_001119be;
          }
          if (lVar6 == lVar4) {
            cVar7 = (edge->Top).X;
          }
          else {
            dVar9 = (double)(lVar4 - (edge->Bot).Y) * edge->Dx;
            cVar7 = (long)(dVar9 + *(double *)(&DAT_0011d070 + (ulong)(dVar9 < 0.0) * 8)) +
                    (edge->Bot).X;
          }
          if (cVar7 < (pTVar5->Top).X) goto LAB_00111a0c;
        }
        else {
LAB_001119be:
          if (bVar8 != lVar4 < 0) goto LAB_00111a0c;
        }
        ppTVar1 = &pTVar5->NextInAEL;
        startEdge = pTVar5;
        pTVar5 = *ppTVar1;
      } while (*ppTVar1 != (TEdge *)0x0);
    }
    pTVar5 = (TEdge *)0x0;
LAB_00111a0c:
    edge->NextInAEL = pTVar5;
    if (startEdge->NextInAEL != (TEdge *)0x0) {
      startEdge->NextInAEL->PrevInAEL = edge;
    }
    edge->PrevInAEL = startEdge;
  }
  startEdge->NextInAEL = edge;
  return;
}

Assistant:

void Clipper::InsertEdgeIntoAEL(TEdge *edge, TEdge* startEdge)
{
  if(!m_ActiveEdges)
  {
    edge->PrevInAEL = 0;
    edge->NextInAEL = 0;
    m_ActiveEdges = edge;
  }
  else if(!startEdge && E2InsertsBeforeE1(*m_ActiveEdges, *edge))
  {
      edge->PrevInAEL = 0;
      edge->NextInAEL = m_ActiveEdges;
      m_ActiveEdges->PrevInAEL = edge;
      m_ActiveEdges = edge;
  } 
  else
  {
    if(!startEdge) startEdge = m_ActiveEdges;
    while(startEdge->NextInAEL  && 
      !E2InsertsBeforeE1(*startEdge->NextInAEL , *edge))
        startEdge = startEdge->NextInAEL;
    edge->NextInAEL = startEdge->NextInAEL;
    if(startEdge->NextInAEL) startEdge->NextInAEL->PrevInAEL = edge;
    edge->PrevInAEL = startEdge;
    startEdge->NextInAEL = edge;
  }
}